

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntermTraverse.cpp
# Opt level: O2

void __thiscall glslang::TIntermAggregate::traverse(TIntermAggregate *this,TIntermTraverser *it)

{
  pointer *pppTVar1;
  int iVar2;
  uint uVar3;
  pointer ppTVar4;
  pointer ppTVar5;
  
  if ((it->preVisit == true) &&
     (iVar2 = (*it->_vptr_TIntermTraverser[7])(it,0,this), (char)iVar2 == '\0')) {
    return;
  }
  TIntermTraverser::incrementDepth(it,(TIntermNode *)this);
  if (it->rightToLeft == true) {
    uVar3 = 1;
    ppTVar5 = (this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
              super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    while (ppTVar4 = ppTVar5 + -1,
          ppTVar5 !=
          (this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
          super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
          super__Vector_impl_data._M_start) {
      (*(*ppTVar4)->_vptr_TIntermNode[2])(*ppTVar4,it);
      ppTVar5 = ppTVar4;
      if ((((uVar3 & 1) != 0) && (it->inVisit == true)) &&
         (*ppTVar4 !=
          *(this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
           super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
           super__Vector_impl_data._M_start)) {
        uVar3 = (*it->_vptr_TIntermTraverser[7])(it,1,this);
      }
    }
  }
  else {
    uVar3 = 1;
    for (ppTVar5 = (this->sequence).
                   super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                   super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        ppTVar5 !=
        (this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
        super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppTVar5 = ppTVar5 + 1) {
      (*(*ppTVar5)->_vptr_TIntermNode[2])(*ppTVar5,it);
      if ((((uVar3 & 1) != 0) && (it->inVisit == true)) &&
         (*ppTVar5 !=
          (this->sequence).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
          super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
          super__Vector_impl_data._M_finish[-1])) {
        uVar3 = (*it->_vptr_TIntermTraverser[7])(it,1,this);
      }
    }
  }
  it->depth = it->depth + -1;
  pppTVar1 = &(it->path).super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
              super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppTVar1 = *pppTVar1 + -1;
  if (((uVar3 & 1) != 0) && (it->postVisit == true)) {
    (*it->_vptr_TIntermTraverser[7])(it,2,this);
    return;
  }
  return;
}

Assistant:

void TIntermAggregate::traverse(TIntermTraverser *it)
{
    bool visit = true;

    if (it->preVisit)
        visit = it->visitAggregate(EvPreVisit, this);

    if (visit) {
        it->incrementDepth(this);

        if (it->rightToLeft) {
            for (TIntermSequence::reverse_iterator sit = sequence.rbegin(); sit != sequence.rend(); sit++) {
                (*sit)->traverse(it);

                if (visit && it->inVisit) {
                    if (*sit != sequence.front())
                        visit = it->visitAggregate(EvInVisit, this);
                }
            }
        } else {
            for (TIntermSequence::iterator sit = sequence.begin(); sit != sequence.end(); sit++) {
                (*sit)->traverse(it);

                if (visit && it->inVisit) {
                    if (*sit != sequence.back())
                        visit = it->visitAggregate(EvInVisit, this);
                }
            }
        }

        it->decrementDepth();
    }

    if (visit && it->postVisit)
        it->visitAggregate(EvPostVisit, this);
}